

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# variable.cpp
# Opt level: O0

void __thiscall
Variable_addVariableDuplicates_Test::TestBody(Variable_addVariableDuplicates_Test *this)

{
  byte bVar1;
  bool bVar2;
  element_type *peVar3;
  char *pcVar4;
  element_type *peVar5;
  AssertHelper local_328 [8];
  Message local_320 [8];
  unsigned_long local_318 [2];
  undefined1 local_308 [8];
  AssertionResult gtest_ar_3;
  Message local_2f0 [8];
  unsigned_long local_2e8 [2];
  undefined1 local_2d8 [8];
  AssertionResult gtest_ar_2;
  AssertHelper local_2a8 [8];
  Message local_2a0 [15];
  bool local_291;
  undefined1 local_290 [8];
  AssertionResult gtest_ar__4;
  Message local_278 [8];
  unsigned_long local_270 [2];
  undefined1 local_260 [8];
  AssertionResult gtest_ar_1;
  AssertHelper local_230 [8];
  Message local_228 [15];
  bool local_219;
  undefined1 local_218 [8];
  AssertionResult gtest_ar__3;
  Message local_200 [8];
  unsigned_long local_1f8 [2];
  undefined1 local_1e8 [8];
  AssertionResult gtest_ar;
  AssertHelper local_1b8 [8];
  Message local_1b0 [15];
  bool local_1a1;
  undefined1 local_1a0 [8];
  AssertionResult gtest_ar__2;
  AssertHelper local_170 [8];
  Message local_168 [15];
  bool local_159;
  undefined1 local_158 [8];
  AssertionResult gtest_ar__1;
  AssertHelper local_128 [8];
  Message local_120 [15];
  bool local_111;
  undefined1 local_110 [8];
  AssertionResult gtest_ar_;
  string local_f8 [32];
  undefined1 local_d8 [8];
  VariablePtr pip;
  string local_c0 [32];
  undefined1 local_a0 [8];
  ComponentPtr apple;
  string local_88 [32];
  undefined1 local_68 [8];
  ComponentPtr tomato;
  allocator<char> local_41;
  string local_40 [32];
  undefined1 local_20 [8];
  ModelPtr model;
  Variable_addVariableDuplicates_Test *this_local;
  
  model.super___shared_ptr<libcellml::Model,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)this;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>(local_40,"model",&local_41);
  libcellml::Model::create((string *)local_20);
  std::__cxx11::string::~string(local_40);
  std::allocator<char>::~allocator(&local_41);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (local_88,"tomato",
             (allocator<char> *)
             ((long)&apple.super___shared_ptr<libcellml::Component,_(__gnu_cxx::_Lock_policy)2>.
                     _M_refcount._M_pi + 7));
  libcellml::Component::create((string *)local_68);
  std::__cxx11::string::~string(local_88);
  std::allocator<char>::~allocator
            ((allocator<char> *)
             ((long)&apple.super___shared_ptr<libcellml::Component,_(__gnu_cxx::_Lock_policy)2>.
                     _M_refcount._M_pi + 7));
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (local_c0,"apple",
             (allocator<char> *)
             ((long)&pip.super___shared_ptr<libcellml::Variable,_(__gnu_cxx::_Lock_policy)2>.
                     _M_refcount._M_pi + 7));
  libcellml::Component::create((string *)local_a0);
  std::__cxx11::string::~string(local_c0);
  std::allocator<char>::~allocator
            ((allocator<char> *)
             ((long)&pip.super___shared_ptr<libcellml::Variable,_(__gnu_cxx::_Lock_policy)2>.
                     _M_refcount._M_pi + 7));
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (local_f8,"pip",(allocator<char> *)((long)&gtest_ar_.message_.ptr_ + 7));
  libcellml::Variable::create((string *)local_d8);
  std::__cxx11::string::~string(local_f8);
  std::allocator<char>::~allocator((allocator<char> *)((long)&gtest_ar_.message_.ptr_ + 7));
  peVar3 = std::__shared_ptr_access<libcellml::Model,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
           operator->((__shared_ptr_access<libcellml::Model,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                       *)local_20);
  bVar1 = libcellml::ComponentEntity::addComponent((shared_ptr *)peVar3);
  local_111 = (bool)(bVar1 & 1);
  testing::AssertionResult::AssertionResult<bool>
            ((AssertionResult *)local_110,&local_111,(type *)0x0);
  bVar2 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_110);
  if (!bVar2) {
    testing::Message::Message(local_120);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((AssertionResult *)&gtest_ar__1.message_,local_110,"model->addComponent(tomato)",
               "false");
    pcVar4 = (char *)std::__cxx11::string::c_str();
    testing::internal::AssertHelper::AssertHelper
              (local_128,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/cellml[P]libcellml/tests/variable/variable.cpp"
               ,0x753,pcVar4);
    testing::internal::AssertHelper::operator=(local_128,local_120);
    testing::internal::AssertHelper::~AssertHelper(local_128);
    std::__cxx11::string::~string((string *)&gtest_ar__1.message_);
    testing::Message::~Message(local_120);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_110);
  peVar3 = std::__shared_ptr_access<libcellml::Model,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
           operator->((__shared_ptr_access<libcellml::Model,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                       *)local_20);
  bVar1 = libcellml::ComponentEntity::addComponent((shared_ptr *)peVar3);
  local_159 = (bool)(bVar1 & 1);
  testing::AssertionResult::AssertionResult<bool>
            ((AssertionResult *)local_158,&local_159,(type *)0x0);
  bVar2 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_158);
  if (!bVar2) {
    testing::Message::Message(local_168);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((AssertionResult *)&gtest_ar__2.message_,local_158,"model->addComponent(apple)",
               "false");
    pcVar4 = (char *)std::__cxx11::string::c_str();
    testing::internal::AssertHelper::AssertHelper
              (local_170,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/cellml[P]libcellml/tests/variable/variable.cpp"
               ,0x754,pcVar4);
    testing::internal::AssertHelper::operator=(local_170,local_168);
    testing::internal::AssertHelper::~AssertHelper(local_170);
    std::__cxx11::string::~string((string *)&gtest_ar__2.message_);
    testing::Message::~Message(local_168);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_158);
  peVar5 = std::__shared_ptr_access<libcellml::Component,_(__gnu_cxx::_Lock_policy)2,_false,_false>
           ::operator->((__shared_ptr_access<libcellml::Component,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                         *)local_68);
  bVar1 = libcellml::Component::addVariable((shared_ptr *)peVar5);
  local_1a1 = (bool)(bVar1 & 1);
  testing::AssertionResult::AssertionResult<bool>
            ((AssertionResult *)local_1a0,&local_1a1,(type *)0x0);
  bVar2 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_1a0);
  if (!bVar2) {
    testing::Message::Message(local_1b0);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((AssertionResult *)&gtest_ar.message_,local_1a0,"tomato->addVariable(pip)","false");
    pcVar4 = (char *)std::__cxx11::string::c_str();
    testing::internal::AssertHelper::AssertHelper
              (local_1b8,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/cellml[P]libcellml/tests/variable/variable.cpp"
               ,0x757,pcVar4);
    testing::internal::AssertHelper::operator=(local_1b8,local_1b0);
    testing::internal::AssertHelper::~AssertHelper(local_1b8);
    std::__cxx11::string::~string((string *)&gtest_ar.message_);
    testing::Message::~Message(local_1b0);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_1a0);
  local_1f8[1] = 1;
  std::__shared_ptr_access<libcellml::Component,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
  operator->((__shared_ptr_access<libcellml::Component,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
             local_68);
  local_1f8[0] = libcellml::Component::variableCount();
  testing::internal::EqHelper<false>::Compare<unsigned_long,unsigned_long>
            ((EqHelper<false> *)local_1e8,"size_t(1)","tomato->variableCount()",local_1f8 + 1,
             local_1f8);
  bVar2 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_1e8);
  if (!bVar2) {
    testing::Message::Message(local_200);
    pcVar4 = testing::AssertionResult::failure_message((AssertionResult *)local_1e8);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar__3.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/cellml[P]libcellml/tests/variable/variable.cpp"
               ,0x758,pcVar4);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar__3.message_,local_200);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar__3.message_);
    testing::Message::~Message(local_200);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_1e8);
  peVar5 = std::__shared_ptr_access<libcellml::Component,_(__gnu_cxx::_Lock_policy)2,_false,_false>
           ::operator->((__shared_ptr_access<libcellml::Component,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                         *)local_68);
  bVar1 = libcellml::Component::addVariable((shared_ptr *)peVar5);
  local_219 = (bool)(bVar1 & 1);
  testing::AssertionResult::AssertionResult<bool>
            ((AssertionResult *)local_218,&local_219,(type *)0x0);
  bVar2 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_218);
  if (!bVar2) {
    testing::Message::Message(local_228);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((AssertionResult *)&gtest_ar_1.message_,local_218,"tomato->addVariable(pip)","false")
    ;
    pcVar4 = (char *)std::__cxx11::string::c_str();
    testing::internal::AssertHelper::AssertHelper
              (local_230,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/cellml[P]libcellml/tests/variable/variable.cpp"
               ,0x75b,pcVar4);
    testing::internal::AssertHelper::operator=(local_230,local_228);
    testing::internal::AssertHelper::~AssertHelper(local_230);
    std::__cxx11::string::~string((string *)&gtest_ar_1.message_);
    testing::Message::~Message(local_228);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_218);
  local_270[1] = 2;
  std::__shared_ptr_access<libcellml::Component,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
  operator->((__shared_ptr_access<libcellml::Component,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
             local_68);
  local_270[0] = libcellml::Component::variableCount();
  testing::internal::EqHelper<false>::Compare<unsigned_long,unsigned_long>
            ((EqHelper<false> *)local_260,"size_t(2)","tomato->variableCount()",local_270 + 1,
             local_270);
  bVar2 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_260);
  if (!bVar2) {
    testing::Message::Message(local_278);
    pcVar4 = testing::AssertionResult::failure_message((AssertionResult *)local_260);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar__4.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/cellml[P]libcellml/tests/variable/variable.cpp"
               ,0x75c,pcVar4);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar__4.message_,local_278);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar__4.message_);
    testing::Message::~Message(local_278);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_260);
  peVar5 = std::__shared_ptr_access<libcellml::Component,_(__gnu_cxx::_Lock_policy)2,_false,_false>
           ::operator->((__shared_ptr_access<libcellml::Component,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                         *)local_a0);
  bVar1 = libcellml::Component::addVariable((shared_ptr *)peVar5);
  local_291 = (bool)(bVar1 & 1);
  testing::AssertionResult::AssertionResult<bool>
            ((AssertionResult *)local_290,&local_291,(type *)0x0);
  bVar2 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_290);
  if (!bVar2) {
    testing::Message::Message(local_2a0);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((AssertionResult *)&gtest_ar_2.message_,local_290,"apple->addVariable(pip)","false");
    pcVar4 = (char *)std::__cxx11::string::c_str();
    testing::internal::AssertHelper::AssertHelper
              (local_2a8,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/cellml[P]libcellml/tests/variable/variable.cpp"
               ,0x760,pcVar4);
    testing::internal::AssertHelper::operator=(local_2a8,local_2a0);
    testing::internal::AssertHelper::~AssertHelper(local_2a8);
    std::__cxx11::string::~string((string *)&gtest_ar_2.message_);
    testing::Message::~Message(local_2a0);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_290);
  local_2e8[1] = 1;
  std::__shared_ptr_access<libcellml::Component,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
  operator->((__shared_ptr_access<libcellml::Component,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
             local_a0);
  local_2e8[0] = libcellml::Component::variableCount();
  testing::internal::EqHelper<false>::Compare<unsigned_long,unsigned_long>
            ((EqHelper<false> *)local_2d8,"size_t(1)","apple->variableCount()",local_2e8 + 1,
             local_2e8);
  bVar2 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_2d8);
  if (!bVar2) {
    testing::Message::Message(local_2f0);
    pcVar4 = testing::AssertionResult::failure_message((AssertionResult *)local_2d8);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_3.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/cellml[P]libcellml/tests/variable/variable.cpp"
               ,0x762,pcVar4);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_3.message_,local_2f0);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_3.message_);
    testing::Message::~Message(local_2f0);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_2d8);
  local_318[1] = 1;
  std::__shared_ptr_access<libcellml::Component,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
  operator->((__shared_ptr_access<libcellml::Component,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
             local_68);
  local_318[0] = libcellml::Component::variableCount();
  testing::internal::EqHelper<false>::Compare<unsigned_long,unsigned_long>
            ((EqHelper<false> *)local_308,"size_t(1)","tomato->variableCount()",local_318 + 1,
             local_318);
  bVar2 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_308);
  if (!bVar2) {
    testing::Message::Message(local_320);
    pcVar4 = testing::AssertionResult::failure_message((AssertionResult *)local_308);
    testing::internal::AssertHelper::AssertHelper
              (local_328,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/cellml[P]libcellml/tests/variable/variable.cpp"
               ,0x763,pcVar4);
    testing::internal::AssertHelper::operator=(local_328,local_320);
    testing::internal::AssertHelper::~AssertHelper(local_328);
    testing::Message::~Message(local_320);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_308);
  std::shared_ptr<libcellml::Variable>::~shared_ptr((shared_ptr<libcellml::Variable> *)local_d8);
  std::shared_ptr<libcellml::Component>::~shared_ptr((shared_ptr<libcellml::Component> *)local_a0);
  std::shared_ptr<libcellml::Component>::~shared_ptr((shared_ptr<libcellml::Component> *)local_68);
  std::shared_ptr<libcellml::Model>::~shared_ptr((shared_ptr<libcellml::Model> *)local_20);
  return;
}

Assistant:

TEST(Variable, addVariableDuplicates)
{
    auto model = libcellml::Model::create("model");
    auto tomato = libcellml::Component::create("tomato");
    auto apple = libcellml::Component::create("apple");
    auto pip = libcellml::Variable::create("pip");

    EXPECT_TRUE(model->addComponent(tomato));
    EXPECT_TRUE(model->addComponent(apple));

    // Adding a pip to the tomato.
    EXPECT_TRUE(tomato->addVariable(pip));
    EXPECT_EQ(size_t(1), tomato->variableCount());

    // Add the same pip again.
    EXPECT_TRUE(tomato->addVariable(pip));
    EXPECT_EQ(size_t(2), tomato->variableCount());

    // Add the same pip to the apple this time, which will effectively move it
    // from the tomato to the apple. Leaving one pip in the tomato.
    EXPECT_TRUE(apple->addVariable(pip));

    EXPECT_EQ(size_t(1), apple->variableCount());
    EXPECT_EQ(size_t(1), tomato->variableCount());
}